

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicationConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicationConstraintSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ConstraintItemSyntax *args_2)

{
  Token arrow;
  ImplicationConstraintSyntax *pIVar1;
  ConstraintItemSyntax *in_RCX;
  BumpAllocator *in_RDX;
  ImplicationConstraintSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pIVar1 = (ImplicationConstraintSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  arrow.info = unaff_retaddr;
  arrow.kind = (short)in_RDI;
  arrow._2_1_ = (char)((ulong)in_RDI >> 0x10);
  arrow.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  arrow.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::ImplicationConstraintSyntax::ImplicationConstraintSyntax
            (in_RSI,(ExpressionSyntax *)in_RDX,arrow,in_RCX);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }